

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

LY_ERR parse_leaflist(lysp_yang_ctx *ctx,lysp_node *parent,lysp_node **siblings)

{
  lysp_ext_instance **exts;
  lyd_node *plVar1;
  LY_ERR LVar2;
  lysp_node *llist;
  lysp_node *plVar3;
  lysp_ext_instance **pplVar4;
  char *format;
  ly_stmt lVar5;
  lysp_restr **extraout_RDX;
  lysp_restr **extraout_RDX_00;
  lysp_node *plVar6;
  lysp_restr **extraout_RDX_01;
  lysp_restr **extraout_RDX_02;
  lysp_restr **restrs;
  ly_ctx *plVar7;
  lysp_ext_instance *parent_00;
  lysp_ext_instance **exts_00;
  char *pcVar8;
  char *pcVar9;
  bool bVar10;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *buf;
  lysp_ext_instance **in_stack_ffffffffffffff50;
  ly_stmt local_a4;
  char *local_a0;
  size_t local_98;
  uint16_t *local_90;
  lysp_node *local_88;
  lysp_ext_instance **local_80;
  lysp_node *local_78;
  uint32_t *local_70;
  uint16_t *local_68;
  lysp_node *local_60;
  lysp_ext_instance **local_58;
  lysp_type *local_50;
  lysp_ext_instance **local_48;
  uint16_t *local_40;
  lysp_ext_instance *local_38;
  
  llist = (lysp_node *)calloc(1,0xd0);
  if (llist == (lysp_node *)0x0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar7 = (ly_ctx *)0x0;
    }
    else {
      plVar7 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_log(plVar7,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_leaflist");
  }
  else {
    plVar6 = *siblings;
    if (*siblings == (lysp_node *)0x0) {
      *siblings = llist;
    }
    else {
      do {
        plVar3 = plVar6;
        plVar6 = plVar3->next;
      } while (plVar6 != (lysp_node *)0x0);
      plVar3->next = llist;
    }
  }
  if (llist == (lysp_node *)0x0) {
    return LY_EMEM;
  }
  llist->nodetype = 8;
  llist->parent = parent;
  exts_00 = &local_38;
  LVar2 = get_argument(ctx,Y_IDENTIF_ARG,(uint16_t *)0x0,&local_a0,(char **)exts_00,&local_98);
  if (LVar2 != LY_SUCCESS) {
    return LVar2 + (LVar2 == LY_SUCCESS);
  }
  if (local_38 == (lysp_ext_instance *)0x0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar7 = (ly_ctx *)0x0;
    }
    else {
      plVar7 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar8 = local_a0;
    if (local_98 == 0) {
      pcVar8 = "";
    }
    LVar2 = lydict_insert(plVar7,pcVar8,local_98,&llist->name);
  }
  else {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar7 = (ly_ctx *)0x0;
    }
    else {
      plVar7 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    LVar2 = lydict_insert_zc(plVar7,local_a0,&llist->name);
  }
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  LVar2 = get_keyword(ctx,&local_a4,&local_a0,&local_98);
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  if (local_a4 == LY_STMT_SYNTAX_SEMICOLON) {
    bVar10 = true;
    restrs = extraout_RDX;
  }
  else {
    if (local_a4 != LY_STMT_SYNTAX_LEFT_BRACE) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar7 = (ly_ctx *)0x0;
      }
      else {
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      pcVar8 = lyplg_ext_stmt2str(local_a4);
      ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\", expected \";\" or \"{\"."
              ,pcVar8);
      return LY_EVALID;
    }
    LVar2 = get_keyword(ctx,&local_a4,&local_a0,&local_98);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    bVar10 = local_a4 == LY_STMT_SYNTAX_RIGHT_BRACE;
    restrs = extraout_RDX_00;
  }
  if (!bVar10) {
    exts = &llist->exts;
    local_40 = &llist[1].nodetype;
    local_48 = &llist[2].exts;
    local_50 = (lysp_type *)&llist[1].next;
    local_90 = &llist->flags;
    local_58 = (lysp_ext_instance **)&llist->ref;
    local_60 = llist + 1;
    local_68 = &llist[3].nodetype;
    local_70 = (uint32_t *)&llist[3].field_0xc;
    local_78 = (lysp_node *)&llist->iffeatures;
    local_80 = (lysp_ext_instance **)&llist->dsc;
    local_88 = llist + 3;
    do {
      if ((int)local_a4 < 0x1d0000) {
        if ((int)local_a4 < 0xf0000) {
          if (local_a4 == LY_STMT_CONFIG) {
            LVar2 = parse_config(ctx,local_90,exts);
          }
          else {
            if (local_a4 != LY_STMT_DEFAULT) {
              if (local_a4 == LY_STMT_DESCRIPTION) {
                parent_00 = *local_80;
                lVar5 = LY_STMT_DESCRIPTION;
                pplVar4 = local_80;
                goto LAB_00177b85;
              }
              goto LAB_00177cae;
            }
            plVar1 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            if (*(byte *)&plVar1[2].schema < 2) {
              if (ctx == (lysp_yang_ctx *)0x0) {
                plVar7 = (ly_ctx *)0x0;
              }
              else {
                plVar7 = (ly_ctx *)**(undefined8 **)plVar1;
              }
              format = 
              "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
              ;
              pcVar8 = "yang:orig-default";
              goto LAB_00177c8f;
            }
            lVar5 = LY_STMT_DEFAULT;
            plVar6 = local_88;
LAB_00177bbd:
            LVar2 = parse_qnames(ctx,lVar5,(lysp_qname **)plVar6,(yang_arg)exts,exts_00);
          }
        }
        else if ((int)local_a4 < 0x190000) {
          if (local_a4 != LY_STMT_EXTENSION_INSTANCE) {
            if (local_a4 == LY_STMT_IF_FEATURE) {
              lVar5 = LY_STMT_IF_FEATURE;
              plVar6 = local_78;
              goto LAB_00177bbd;
            }
LAB_00177cae:
            if (ctx == (lysp_yang_ctx *)0x0) {
              plVar7 = (ly_ctx *)0x0;
            }
            else {
              plVar7 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            pcVar8 = lyplg_ext_stmt2str(local_a4);
            format = "Invalid keyword \"%s\" as a child of \"%s\".";
            pcVar9 = "llist";
            goto LAB_00177c9d;
          }
          exts_00 = (lysp_ext_instance **)0x2000;
          LVar2 = parse_ext(ctx,local_a0,local_98,llist,LY_STMT_LEAF_LIST,0,exts);
        }
        else if (local_a4 == LY_STMT_MAX_ELEMENTS) {
          LVar2 = parse_maxelements(ctx,local_70,local_90,exts);
        }
        else {
          if (local_a4 != LY_STMT_MIN_ELEMENTS) goto LAB_00177cae;
          LVar2 = parse_minelements(ctx,(uint32_t *)local_68,local_90,exts);
        }
      }
      else if ((int)local_a4 < 0x2c0000) {
        if (local_a4 == LY_STMT_MUST) {
          LVar2 = parse_restrs(ctx,(ly_stmt)local_60,restrs);
        }
        else {
          if (local_a4 != LY_STMT_ORDERED_BY) {
            if (local_a4 != LY_STMT_REFERENCE) goto LAB_00177cae;
            parent_00 = *local_58;
            lVar5 = LY_STMT_REFERENCE;
            pplVar4 = local_58;
            goto LAB_00177b85;
          }
          LVar2 = parse_orderedby(ctx,llist);
        }
      }
      else if ((int)local_a4 < 0x310000) {
        if (local_a4 == LY_STMT_STATUS) {
          LVar2 = parse_status(ctx,local_90,exts);
        }
        else {
          if (local_a4 != LY_STMT_TYPE) goto LAB_00177cae;
          LVar2 = parse_type(ctx,local_50);
        }
      }
      else if (local_a4 == LY_STMT_UNITS) {
        parent_00 = *local_48;
        lVar5 = LY_STMT_UNITS;
        pplVar4 = local_48;
LAB_00177b85:
        exts_00 = (lysp_ext_instance **)0x2;
        LVar2 = parse_text_field(ctx,parent_00,lVar5,(uint32_t)pplVar4,(char **)0x2,Y_IDENTIF_ARG,
                                 (uint16_t *)exts,in_stack_ffffffffffffff50);
      }
      else {
        if (local_a4 != LY_STMT_WHEN) goto LAB_00177cae;
        LVar2 = parse_when(ctx,(lysp_when **)local_40);
      }
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      LVar2 = get_keyword(ctx,&local_a4,&local_a0,&local_98);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      restrs = extraout_RDX_01;
      if (local_a4 == LY_STMT_SYNTAX_RIGHT_BRACE) {
        bVar10 = true;
        if ((llist->exts != (lysp_ext_instance *)0x0) &&
           (LVar2 = ly_set_add(&ctx->main_ctx->ext_inst,llist->exts,'\x01',(uint32_t *)0x0),
           restrs = extraout_RDX_02, LVar2 != LY_SUCCESS)) {
          return LVar2;
        }
      }
    } while (!bVar10);
  }
  if (llist[1].next != (lysp_node *)0x0) {
    return LY_SUCCESS;
  }
  if (ctx == (lysp_yang_ctx *)0x0) {
    plVar7 = (ly_ctx *)0x0;
  }
  else {
    plVar7 = (ly_ctx *)
             **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  format = "Missing mandatory keyword \"%s\" as a child of \"%s\".";
  pcVar8 = "decimal64 type";
LAB_00177c8f:
  pcVar8 = pcVar8 + 10;
  pcVar9 = "leaf-list";
LAB_00177c9d:
  ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar8,pcVar9);
  return LY_EVALID;
}

Assistant:

LY_ERR
parse_leaflist(struct lysp_yang_ctx *ctx, struct lysp_node *parent, struct lysp_node **siblings)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_node_leaflist *llist;

    /* create new leaf-list structure */
    LY_LIST_NEW_RET(PARSER_CTX(ctx), siblings, llist, next, LY_EMEM);
    llist->nodetype = LYS_LEAFLIST;
    llist->parent = parent;

    /* get name */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, llist->name, word, word_len, ret, cleanup);

    /* parse substatements */
    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(parse_config(ctx, &llist->flags, &llist->exts));
            break;
        case LY_STMT_DEFAULT:
            PARSER_CHECK_STMTVER2_RET(ctx, "default", "leaf-list");
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_DEFAULT, &llist->dflts, Y_STR_ARG, &llist->exts));
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, llist->dsc, LY_STMT_DESCRIPTION, 0, &llist->dsc, Y_STR_ARG, NULL, &llist->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_IF_FEATURE, &llist->iffeatures, Y_STR_ARG, &llist->exts));
            break;
        case LY_STMT_MAX_ELEMENTS:
            LY_CHECK_RET(parse_maxelements(ctx, &llist->max, &llist->flags, &llist->exts));
            break;
        case LY_STMT_MIN_ELEMENTS:
            LY_CHECK_RET(parse_minelements(ctx, &llist->min, &llist->flags, &llist->exts));
            break;
        case LY_STMT_MUST:
            LY_CHECK_RET(parse_restrs(ctx, kw, &llist->musts));
            break;
        case LY_STMT_ORDERED_BY:
            LY_CHECK_RET(parse_orderedby(ctx, &llist->node));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, llist->ref, LY_STMT_REFERENCE, 0, &llist->ref, Y_STR_ARG, NULL, &llist->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &llist->flags, &llist->exts));
            break;
        case LY_STMT_TYPE:
            LY_CHECK_RET(parse_type(ctx, &llist->type));
            break;
        case LY_STMT_UNITS:
            LY_CHECK_RET(parse_text_field(ctx, llist->units, LY_STMT_UNITS, 0, &llist->units, Y_STR_ARG, NULL, &llist->exts));
            break;
        case LY_STMT_WHEN:
            LY_CHECK_RET(parse_when(ctx, &llist->when));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, llist, LY_STMT_LEAF_LIST, 0, &llist->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "llist");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, llist->exts, ret, cleanup);
    }

    /* mandatory substatements */
    if (!llist->type.name) {
        LOGVAL_PARSER(ctx, LY_VCODE_MISSTMT, "type", "leaf-list");
        return LY_EVALID;
    }

cleanup:
    return ret;
}